

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

int __thiscall QList<QList<QString>_>::remove(QList<QList<QString>_> *this,char *__filename)

{
  QList<QList<QString>_> *extraout_RAX;
  long in_RDX;
  qsizetype in_stack_00000010;
  QList<QString> *in_stack_00000018;
  QMovableArrayOps<QList<QString>_> *in_stack_00000020;
  QArrayDataPointer<QList<QString>_> *in_stack_ffffffffffffffd8;
  
  if (in_RDX != 0) {
    QArrayDataPointer<QList<QString>_>::detach(&this->d,in_stack_ffffffffffffffd8);
    QArrayDataPointer<QList<QString>_>::operator->(&this->d);
    QArrayDataPointer<QList<QString>_>::operator->(&this->d);
    QArrayDataPointer<QList<QString>_>::begin((QArrayDataPointer<QList<QString>_> *)0xb153f9);
    QtPrivate::QMovableArrayOps<QList<QString>_>::erase
              (in_stack_00000020,in_stack_00000018,in_stack_00000010);
    this = extraout_RAX;
  }
  return (int)this;
}

Assistant:

inline void QList<T>::remove(qsizetype i, qsizetype n)
{
    Q_ASSERT_X(size_t(i) + size_t(n) <= size_t(d->size), "QList::remove", "index out of range");
    Q_ASSERT_X(n >= 0, "QList::remove", "invalid count");

    if (n == 0)
        return;

    d.detach();
    d->erase(d->begin() + i, n);
}